

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx::BVHNBuilderMBlurSAHGrid<4>::createPrimRefArrayMSMBlurGrid
          (PrimInfoMB *__return_storage_ptr__,BVHNBuilderMBlurSAHGrid<4> *this,Scene *scene,
          mvector<PrimRefMB> *prims,BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  Geometry *pGVar6;
  Ref<embree::Geometry> *pRVar7;
  SubGridBuildData *ptr;
  PrimRefMB *ptr_00;
  MemoryMonitorInterface *pMVar8;
  unsigned_long uVar9;
  size_t sVar10;
  size_t sVar11;
  BBox1f BVar12;
  char cVar13;
  int iVar14;
  ulong uVar15;
  unsigned_long uVar16;
  SubGridBuildData *pSVar17;
  PrimRefMB *pPVar18;
  runtime_error *prVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  mvector<PrimRefMB> *pmVar24;
  size_t sVar25;
  BBox1f *pBVar26;
  BBox1f BVar27;
  ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pPVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  BBox1f BVar33;
  unsigned_long uVar34;
  bool bVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  undefined1 in_register_00001208 [56];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar41;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar42;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar45;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar46;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar47;
  undefined1 auVar50 [16];
  range<unsigned_long> rVar51;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  size_t taskCount_1;
  size_t taskCount;
  Iterator<embree::GridMesh,_true> iter;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  anon_class_1_0_00000001 local_4dea;
  auto_partitioner local_4de9;
  mvector<PrimRefMB> *local_4de8;
  BBox1f local_4de0;
  BBox1f local_4dd8;
  BBox1f local_4dd0;
  BBox1f local_4dc8;
  Scene *local_4dc0;
  bool local_4db8;
  anon_class_16_2_341d598e_conflict2 local_4db0;
  anon_class_16_2_341d598e_conflict2 local_4da0;
  mvector<PrimRefMB> *local_4d90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4d88;
  undefined4 local_4d78;
  undefined4 uStack_4d74;
  undefined4 uStack_4d70;
  undefined4 uStack_4d6c;
  undefined4 local_4d68;
  undefined4 uStack_4d64;
  undefined4 uStack_4d60;
  undefined4 uStack_4d5c;
  undefined4 local_4d58;
  undefined4 uStack_4d54;
  undefined4 uStack_4d50;
  undefined4 uStack_4d4c;
  undefined4 local_4d48;
  undefined4 uStack_4d44;
  undefined4 uStack_4d40;
  undefined4 uStack_4d3c;
  undefined4 local_4d38;
  undefined4 uStack_4d34;
  undefined4 uStack_4d30;
  undefined4 uStack_4d2c;
  unsigned_long local_4d28;
  unsigned_long uStack_4d20;
  BBox1f BStack_4d18;
  BBox1f BStack_4d10;
  float local_4d08;
  float fStack_4d04;
  float fStack_4d00;
  float fStack_4cfc;
  anon_class_48_6_afa08d2e_conflict2 local_4cf8;
  task_group_context local_4cc8;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> local_4c48;
  
  auVar52._8_56_ = in_register_00001208;
  auVar52._0_8_ = t0t1;
  local_4de0 = (BBox1f)vmovlps_avx(auVar52._0_16_);
  local_4c48.super_ParallelForForState.taskCount = 0;
  local_4db8 = false;
  sVar29 = (scene->geometries).size_active;
  if (sVar29 == 0) {
    uVar32 = 0;
  }
  else {
    uVar32 = 0;
    sVar25 = 0;
    do {
      pGVar6 = (scene->geometries).items[sVar25].ptr;
      if (((pGVar6 == (Geometry *)0x0) || (((uint)pGVar6->field_8 & 0x2000ff) != 0x200016)) ||
         (pGVar6->numTimeSteps == 1)) {
        uVar20 = 0;
      }
      else {
        uVar20 = (ulong)pGVar6->numPrimitives;
      }
      uVar32 = uVar32 + uVar20;
      sVar25 = sVar25 + 1;
    } while (sVar29 != sVar25);
  }
  local_4de8 = prims;
  local_4dc0 = scene;
  local_4c48.super_ParallelForForState.N = uVar32;
  iVar14 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar20 = uVar32 + 0x3ff >> 10;
  if ((ulong)(long)iVar14 < uVar20) {
    uVar20 = (long)iVar14;
  }
  uVar31 = 0x40;
  if (uVar20 < 0x40) {
    uVar31 = uVar20;
  }
  BVar33 = (BBox1f)(uVar31 + (uVar31 == 0));
  local_4c48.super_ParallelForForState.i0[0] = 0;
  local_4c48.super_ParallelForForState.j0[0] = 0;
  local_4c48.super_ParallelForForState.taskCount = (size_t)BVar33;
  if (1 < uVar20) {
    uVar31 = 0;
    uVar20 = uVar32 / (ulong)BVar33;
    pRVar7 = (scene->geometries).items;
    BVar27.lower = 1.4013e-45;
    BVar27.upper = 0.0;
    sVar29 = 0;
    do {
      pGVar6 = pRVar7[sVar29].ptr;
      if (((pGVar6 == (Geometry *)0x0) || (((uint)pGVar6->field_8 & 0x2000ff) != 0x200016)) ||
         ((pGVar6->numTimeSteps == 1 || (uVar30 = (ulong)pGVar6->numPrimitives, uVar30 == 0)))) {
        uVar30 = 0;
        lVar22 = 0;
      }
      else {
        uVar21 = ((long)BVar27 + 1U) * uVar32;
        lVar22 = 0;
        uVar23 = 0;
        do {
          uVar15 = uVar20;
          uVar20 = uVar15;
          if ((uVar31 + uVar30 + lVar22 < uVar15) || ((ulong)BVar33 <= (ulong)BVar27)) break;
          local_4c48.super_ParallelForForState.i0[(long)BVar27] = sVar29;
          uVar23 = uVar23 + (uVar15 - uVar31);
          local_4c48.super_ParallelForForState.j0[(long)BVar27] = uVar23;
          BVar27 = (BBox1f)((long)BVar27 + 1);
          uVar20 = uVar21 / local_4c48.super_ParallelForForState.taskCount;
          lVar22 = -uVar23;
          uVar21 = uVar21 + uVar32;
          uVar31 = uVar15;
          BVar33 = (BBox1f)local_4c48.super_ParallelForForState.taskCount;
        } while (uVar23 < uVar30);
      }
      uVar31 = uVar30 + uVar31 + lVar22;
      sVar29 = sVar29 + 1;
    } while ((ulong)BVar27 < (ulong)BVar33);
  }
  local_4cf8.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d88;
  local_4d88.m128[0] = INFINITY;
  local_4d88.m128[1] = INFINITY;
  local_4d88.m128[2] = INFINITY;
  local_4d88.m128[3] = INFINITY;
  local_4d78 = 0xff800000;
  uStack_4d74 = 0xff800000;
  uStack_4d70 = 0xff800000;
  uStack_4d6c = 0xff800000;
  local_4d68 = 0x7f800000;
  uStack_4d64 = 0x7f800000;
  uStack_4d60 = 0x7f800000;
  uStack_4d5c = 0x7f800000;
  local_4d58 = 0xff800000;
  uStack_4d54 = 0xff800000;
  uStack_4d50 = 0xff800000;
  uStack_4d4c = 0xff800000;
  local_4d48 = 0x7f800000;
  uStack_4d44 = 0x7f800000;
  uStack_4d40 = 0x7f800000;
  uStack_4d3c = 0x7f800000;
  local_4d38 = 0xff800000;
  uStack_4d34 = 0xff800000;
  uStack_4d30 = 0xff800000;
  uStack_4d2c = 0xff800000;
  local_4d28 = 0;
  uStack_4d20 = 0;
  BStack_4d18.lower = 0.0;
  BStack_4d18.upper = 0.0;
  BStack_4d10.lower = 0.0;
  BStack_4d10.upper = 0.0;
  local_4d08 = 0.0;
  auVar58._8_4_ = 0x3f800000;
  auVar58._0_8_ = 0x3f8000003f800000;
  auVar58._12_4_ = 0x3f800000;
  uVar4 = vmovlps_avx(auVar58);
  fStack_4d04 = (float)uVar4;
  fStack_4d00 = (float)((ulong)uVar4 >> 0x20);
  fStack_4cfc = 0.0;
  local_4dd0 = (BBox1f)&local_4de0;
  local_4da0.func = (anon_class_8_1_89912a77 *)&local_4dd0;
  local_4dd8 = (BBox1f)&local_4dc0;
  local_4cf8.getSize = (anon_class_8_1_4d25ca37_conflict *)&local_4dd8;
  local_4cf8.func = &local_4da0;
  local_4cf8.taskCount = (size_t *)&local_4dc8;
  local_4cf8.state = &local_4c48;
  local_4cf8.reduction = &local_4dea;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4dc8 = BVar33;
  local_4da0.array2 = (Iterator<embree::GridMesh,_true> *)local_4dd8;
  tbb::detail::r1::initialize(&local_4cc8);
  local_4db0.func = (anon_class_8_1_89912a77 *)&local_4cf8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,(unsigned_long)BVar33,1,(anon_class_8_1_898bcfc2_conflict10 *)&local_4db0,&local_4de9
             ,&local_4cc8);
  cVar13 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  pmVar24 = local_4de8;
  if (cVar13 != '\0') {
    prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar19,"task cancelled");
    __cxa_throw(prVar19,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_4cc8);
  aVar36.m128[1] = local_4d88.m128[1];
  aVar36.m128[0] = local_4d88.m128[0];
  aVar36.m128[2] = local_4d88.m128[2];
  aVar36.m128[3] = local_4d88.m128[3];
  aVar38.m128[1] = (float)uStack_4d74;
  aVar38.m128[0] = (float)local_4d78;
  aVar38.m128[2] = (float)uStack_4d70;
  aVar38.m128[3] = (float)uStack_4d6c;
  aVar40.m128[1] = (float)uStack_4d64;
  aVar40.m128[0] = (float)local_4d68;
  aVar40.m128[2] = (float)uStack_4d60;
  aVar40.m128[3] = (float)uStack_4d5c;
  aVar42.m128[1] = (float)uStack_4d54;
  aVar42.m128[0] = (float)local_4d58;
  aVar42.m128[2] = (float)uStack_4d50;
  aVar42.m128[3] = (float)uStack_4d4c;
  aVar44.m128[1] = (float)uStack_4d44;
  aVar44.m128[0] = (float)local_4d48;
  aVar44.m128[2] = (float)uStack_4d40;
  aVar44.m128[3] = (float)uStack_4d3c;
  aVar46.m128[1] = (float)uStack_4d34;
  aVar46.m128[0] = (float)local_4d38;
  aVar46.m128[2] = (float)uStack_4d30;
  aVar46.m128[3] = (float)uStack_4d2c;
  (__return_storage_ptr__->object_range)._begin = local_4d28;
  (__return_storage_ptr__->object_range)._end = uStack_4d20;
  BVar33.upper = fStack_4d04;
  BVar33.lower = local_4d08;
  BVar12.upper = fStack_4cfc;
  BVar12.lower = fStack_4d00;
  __return_storage_ptr__->num_time_segments = (size_t)BStack_4d18;
  __return_storage_ptr__->max_num_time_segments = (size_t)BStack_4d10;
  __return_storage_ptr__->max_time_range = BVar33;
  __return_storage_ptr__->time_range = BVar12;
  uVar16 = local_4d28;
  uVar34 = uStack_4d20;
  if (local_4dc8 != (BBox1f)0x0) {
    sVar29 = __return_storage_ptr__->num_time_segments;
    sVar25 = __return_storage_ptr__->max_num_time_segments;
    pPVar28 = &local_4c48.prefix_state;
    auVar48._8_8_ = 0;
    auVar48._0_4_ = (__return_storage_ptr__->max_time_range).lower;
    auVar48._4_4_ = (__return_storage_ptr__->max_time_range).upper;
    auVar52 = ZEXT864((ulong)__return_storage_ptr__->time_range);
    BVar33 = local_4dc8;
    do {
      uVar32 = pPVar28->counts[0].max_num_time_segments;
      uVar3 = pPVar28->counts[0].max_time_range.lower;
      uVar5 = pPVar28->counts[0].max_time_range.upper;
      auVar53._4_4_ = uVar5;
      auVar53._0_4_ = uVar3;
      auVar53._8_8_ = 0;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
      field_0 = aVar36;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
      field_0 = aVar38;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
      field_0 = aVar40;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
      field_0 = aVar42;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0 =
           aVar44;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0 =
           aVar46;
      aVar36.m128 = (__m128)vminps_avx(aVar36.m128,
                                       pPVar28->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                                       bounds0.lower.field_0);
      aVar38.m128 = (__m128)vmaxps_avx(aVar38.m128,
                                       pPVar28->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                                       bounds0.upper.field_0);
      aVar40.m128 = (__m128)vminps_avx(aVar40.m128,
                                       pPVar28->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                                       bounds1.lower.field_0);
      aVar42.m128 = (__m128)vmaxps_avx(aVar42.m128,
                                       pPVar28->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                                       bounds1.upper.field_0);
      aVar44.m128 = (__m128)vminps_avx(aVar44.m128,
                                       pPVar28->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                                       lower.field_0);
      aVar46.m128 = (__m128)vmaxps_avx(aVar46.m128,
                                       pPVar28->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                                       upper.field_0);
      uVar16 = uVar16 + pPVar28->counts[0].object_range._begin;
      uVar34 = uVar34 + pPVar28->counts[0].object_range._end;
      sVar29 = sVar29 + pPVar28->counts[0].num_time_segments;
      uVar9 = (__return_storage_ptr__->object_range)._end;
      sVar10 = __return_storage_ptr__->num_time_segments;
      sVar11 = __return_storage_ptr__->max_num_time_segments;
      pPVar28->sums[0].object_range._begin = (__return_storage_ptr__->object_range)._begin;
      pPVar28->sums[0].object_range._end = uVar9;
      pPVar28->sums[0].num_time_segments = sVar10;
      pPVar28->sums[0].max_num_time_segments = sVar11;
      auVar50 = auVar52._0_16_;
      auVar58 = vmovlhps_avx(auVar48,auVar50);
      pPVar28->sums[0].max_time_range.lower = (float)(int)auVar58._0_8_;
      pPVar28->sums[0].max_time_range.upper = (float)(int)((ulong)auVar58._0_8_ >> 0x20);
      pPVar28->sums[0].time_range.lower = (float)(int)auVar58._8_8_;
      pPVar28->sums[0].time_range.upper = (float)(int)((ulong)auVar58._8_8_ >> 0x20);
      auVar54._8_8_ = 0;
      auVar54._0_4_ = pPVar28->counts[0].time_range.lower;
      auVar54._4_4_ = pPVar28->counts[0].time_range.upper;
      auVar55 = vcmpps_avx(auVar50,auVar54,1);
      auVar49 = vinsertps_avx(auVar50,auVar54,0x50);
      auVar58 = vblendps_avx(auVar54,auVar50,2);
      auVar58 = vblendvps_avx(auVar58,auVar49,auVar55);
      auVar52 = ZEXT1664(auVar58);
      bVar35 = sVar25 < uVar32;
      if (sVar25 <= uVar32) {
        sVar25 = uVar32;
      }
      auVar55 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar32 >> 8),bVar35)),0x50);
      auVar55 = vpslld_avx(auVar55,0x1f);
      auVar48 = vblendvps_avx(auVar48,auVar53,auVar55);
      (__return_storage_ptr__->object_range)._begin = uVar16;
      (__return_storage_ptr__->object_range)._end = uVar34;
      __return_storage_ptr__->num_time_segments = sVar29;
      __return_storage_ptr__->max_num_time_segments = sVar25;
      pPVar28 = (ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)
                (pPVar28->counts + 1);
      BVar33 = (BBox1f)((long)BVar33 - 1);
    } while (BVar33 != (BBox1f)0x0);
    auVar58 = vmovlhps_avx(auVar48,auVar58);
    (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar58._0_8_;
    (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar58._0_8_ >> 0x20);
    (__return_storage_ptr__->time_range).lower = (float)(int)auVar58._8_8_;
    (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar58._8_8_ >> 0x20);
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar36;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar38;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar40;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar42;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar44;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar46;
  uVar32 = uVar34 - uVar16;
  if (uVar32 == 0) {
    return __return_storage_ptr__;
  }
  uVar20 = (this->sgrids).size_alloced;
  uVar31 = uVar20;
  if ((uVar20 < uVar32) && (uVar31 = uVar32, uVar30 = uVar20, uVar20 != 0)) {
    do {
      uVar31 = uVar30 * 2 + (ulong)(uVar30 * 2 == 0);
      uVar30 = uVar31;
    } while (uVar31 < uVar32);
  }
  if (uVar32 < (this->sgrids).size_active) {
    (this->sgrids).size_active = uVar32;
  }
  if (uVar20 == uVar31) {
    (this->sgrids).size_active = uVar32;
  }
  else {
    pMVar8 = (this->sgrids).alloc.device;
    ptr = (this->sgrids).items;
    uVar20 = uVar31 * 8;
    (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,uVar20,0);
    if (uVar20 < 0x1c00000) {
      pSVar17 = (SubGridBuildData *)alignedMalloc(uVar20,4);
    }
    else {
      pSVar17 = (SubGridBuildData *)os_malloc(uVar20,&(this->sgrids).alloc.hugepages);
    }
    (this->sgrids).items = pSVar17;
    if ((this->sgrids).size_active == 0) {
      sVar29 = (this->sgrids).size_alloced;
      if (ptr != (SubGridBuildData *)0x0) goto LAB_0137b26a;
    }
    else {
      uVar20 = 0;
      do {
        (this->sgrids).items[uVar20] = ptr[uVar20];
        uVar20 = uVar20 + 1;
      } while (uVar20 < (this->sgrids).size_active);
      sVar29 = (this->sgrids).size_alloced;
LAB_0137b26a:
      if (sVar29 * 8 < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,sVar29 * 8,(this->sgrids).alloc.hugepages);
      }
    }
    if (sVar29 != 0) {
      pMVar8 = (this->sgrids).alloc.device;
      (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar29 * -8,1);
    }
    (this->sgrids).size_active = uVar32;
    (this->sgrids).size_alloced = uVar31;
    pmVar24 = local_4de8;
  }
  uVar20 = pmVar24->size_alloced;
  uVar31 = uVar20;
  if ((uVar20 < uVar32) && (uVar31 = uVar32, uVar30 = uVar20, uVar20 != 0)) {
    do {
      uVar31 = uVar30 * 2 + (ulong)(uVar30 * 2 == 0);
      uVar30 = uVar31;
    } while (uVar31 < uVar32);
  }
  if (uVar32 < pmVar24->size_active) {
    pmVar24->size_active = uVar32;
  }
  if (uVar20 == uVar31) {
    pmVar24->size_active = uVar32;
    goto LAB_0137b426;
  }
  ptr_00 = pmVar24->items;
  if (uVar31 == 0) {
    uVar20 = 0;
LAB_0137b33e:
    pPVar18 = (PrimRefMB *)alignedMalloc(uVar20,0x10);
  }
  else {
    pMVar8 = (pmVar24->alloc).device;
    uVar20 = uVar31 * 0x50;
    (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,uVar20,0);
    if (uVar20 < 0x1c00000) goto LAB_0137b33e;
    pPVar18 = (PrimRefMB *)os_malloc(uVar20,&(local_4de8->alloc).hugepages);
  }
  local_4de8->items = pPVar18;
  if (local_4de8->size_active == 0) {
    sVar29 = local_4de8->size_alloced;
    if (ptr_00 != (PrimRefMB *)0x0) goto LAB_0137b3c2;
  }
  else {
    lVar22 = 0x40;
    uVar20 = 0;
    do {
      pPVar18 = local_4de8->items;
      puVar1 = (undefined8 *)((long)ptr_00 + lVar22 + -0x40);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)pPVar18 + lVar22 + -0x40);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      puVar1 = (undefined8 *)((long)ptr_00 + lVar22 + -0x30);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)pPVar18 + lVar22 + -0x30);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      puVar1 = (undefined8 *)((long)ptr_00 + lVar22 + -0x20);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)pPVar18 + lVar22 + -0x20);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      puVar1 = (undefined8 *)((long)ptr_00 + lVar22 + -0x10);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)pPVar18 + lVar22 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      *(undefined8 *)((long)&(pPVar18->lbounds).bounds0.lower.field_0 + lVar22) =
           *(undefined8 *)((long)&(ptr_00->lbounds).bounds0.lower.field_0 + lVar22);
      uVar20 = uVar20 + 1;
      lVar22 = lVar22 + 0x50;
    } while (uVar20 < local_4de8->size_active);
    sVar29 = local_4de8->size_alloced;
LAB_0137b3c2:
    if (sVar29 * 0x50 < 0x1c00000) {
      alignedFree(ptr_00);
    }
    else {
      os_free(ptr_00,sVar29 * 0x50,(local_4de8->alloc).hugepages);
    }
  }
  pmVar24 = local_4de8;
  if (sVar29 != 0) {
    pMVar8 = (local_4de8->alloc).device;
    (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar29 * -0x50,1);
  }
  pmVar24->size_active = uVar32;
  pmVar24->size_alloced = uVar31;
LAB_0137b426:
  sVar29 = local_4c48.super_ParallelForForState.taskCount;
  local_4d88.m128[0] = INFINITY;
  local_4d88.m128[1] = INFINITY;
  local_4d88.m128[2] = INFINITY;
  local_4d88.m128[3] = INFINITY;
  local_4d78 = 0xff800000;
  uStack_4d74 = 0xff800000;
  uStack_4d70 = 0xff800000;
  uStack_4d6c = 0xff800000;
  local_4d68 = 0x7f800000;
  uStack_4d64 = 0x7f800000;
  uStack_4d60 = 0x7f800000;
  uStack_4d5c = 0x7f800000;
  local_4d58 = 0xff800000;
  uStack_4d54 = 0xff800000;
  uStack_4d50 = 0xff800000;
  uStack_4d4c = 0xff800000;
  local_4d48 = 0x7f800000;
  uStack_4d44 = 0x7f800000;
  uStack_4d40 = 0x7f800000;
  uStack_4d3c = 0x7f800000;
  local_4d38 = 0xff800000;
  uStack_4d34 = 0xff800000;
  uStack_4d30 = 0xff800000;
  uStack_4d2c = 0xff800000;
  local_4d28 = 0;
  uStack_4d20 = 0;
  BStack_4d18.lower = 0.0;
  BStack_4d18.upper = 0.0;
  BStack_4d10.lower = 0.0;
  BStack_4d10.upper = 0.0;
  local_4d08 = 0.0;
  auVar55._8_4_ = 0x3f800000;
  auVar55._0_8_ = 0x3f8000003f800000;
  auVar55._12_4_ = 0x3f800000;
  uVar4 = vmovlps_avx(auVar55);
  fStack_4d04 = (float)uVar4;
  fStack_4d00 = (float)((ulong)uVar4 >> 0x20);
  fStack_4cfc = 0.0;
  local_4da0.func = (anon_class_8_1_89912a77 *)&local_4de0;
  local_4dd0 = (BBox1f)&local_4dc0;
  local_4db0.func = (anon_class_8_1_89912a77 *)&local_4da0;
  local_4dd8.lower = (float)(undefined4)local_4c48.super_ParallelForForState.taskCount;
  local_4dd8.upper = (float)local_4c48.super_ParallelForForState.taskCount._4_4_;
  local_4cf8.state = &local_4c48;
  local_4cf8.taskCount = (size_t *)&local_4dd8;
  local_4cf8.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d88;
  local_4cf8.getSize = (anon_class_8_1_4d25ca37_conflict *)&local_4dd0;
  local_4cf8.reduction = &local_4dea;
  local_4cf8.func = &local_4db0;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4db0.array2 = (Iterator<embree::GridMesh,_true> *)local_4dd0;
  local_4da0.array2 = (Iterator<embree::GridMesh,_true> *)this;
  local_4d90 = pmVar24;
  tbb::detail::r1::initialize(&local_4cc8);
  local_4dc8 = (BBox1f)&local_4cf8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,sVar29,1,(anon_class_8_1_898bcfc2_conflict10 *)&local_4dc8,&local_4de9,&local_4cc8);
  cVar13 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  if (cVar13 == '\0') {
    tbb::detail::r1::destroy(&local_4cc8);
    aVar47.m128[1] = local_4d88.m128[1];
    aVar47.m128[0] = local_4d88.m128[0];
    aVar47.m128[2] = local_4d88.m128[2];
    aVar47.m128[3] = local_4d88.m128[3];
    aVar45.m128[1] = (float)uStack_4d74;
    aVar45.m128[0] = (float)local_4d78;
    aVar45.m128[2] = (float)uStack_4d70;
    aVar45.m128[3] = (float)uStack_4d6c;
    aVar43.m128[1] = (float)uStack_4d64;
    aVar43.m128[0] = (float)local_4d68;
    aVar43.m128[2] = (float)uStack_4d60;
    aVar43.m128[3] = (float)uStack_4d5c;
    aVar41.m128[1] = (float)uStack_4d54;
    aVar41.m128[0] = (float)local_4d58;
    aVar41.m128[2] = (float)uStack_4d50;
    aVar41.m128[3] = (float)uStack_4d4c;
    aVar39.m128[1] = (float)uStack_4d44;
    aVar39.m128[0] = (float)local_4d48;
    aVar39.m128[2] = (float)uStack_4d40;
    aVar39.m128[3] = (float)uStack_4d3c;
    aVar37.m128[1] = (float)uStack_4d34;
    aVar37.m128[0] = (float)local_4d38;
    aVar37.m128[2] = (float)uStack_4d30;
    aVar37.m128[3] = (float)uStack_4d2c;
    rVar51._end = uStack_4d20;
    rVar51._begin = local_4d28;
    auVar49._4_4_ = fStack_4d04;
    auVar49._0_4_ = local_4d08;
    auVar49._8_8_ = 0;
    if (local_4dd8 != (BBox1f)0x0) {
      auVar50._4_4_ = fStack_4cfc;
      auVar50._0_4_ = fStack_4d00;
      auVar50._8_8_ = 0;
      pBVar26 = &local_4c48.prefix_state.sums[0].time_range;
      do {
        BVar27 = pBVar26[-0x482];
        auVar56._8_8_ = 0;
        auVar56._0_4_ = pBVar26[-0x481].lower;
        auVar56._4_4_ = pBVar26[-0x481].upper;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar26 + -0x11) = aVar47;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar26 + -0xf) = aVar45;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar26 + -0xd) = aVar43;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar26 + -0xb) = aVar41;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar26 + -9) = aVar39;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar26 + -7) = aVar37;
        *(range<unsigned_long> *)(pBVar26 + -5) = rVar51;
        pBVar26[-3] = BStack_4d18;
        pBVar26[-2] = BStack_4d10;
        BVar33 = (BBox1f)vmovlps_avx(auVar49);
        pBVar26[-1] = BVar33;
        aVar47.m128 = (__m128)vminps_avx(aVar47.m128,*(undefined1 (*) [16])(pBVar26 + -0x491));
        aVar45.m128 = (__m128)vmaxps_avx(aVar45.m128,*(undefined1 (*) [16])(pBVar26 + -0x48f));
        aVar43.m128 = (__m128)vminps_avx(aVar43.m128,*(undefined1 (*) [16])(pBVar26 + -0x48d));
        aVar41.m128 = (__m128)vmaxps_avx(aVar41.m128,*(undefined1 (*) [16])(pBVar26 + -0x48b));
        aVar39.m128 = (__m128)vminps_avx(aVar39.m128,*(undefined1 (*) [16])(pBVar26 + -0x489));
        aVar37.m128 = (__m128)vmaxps_avx(aVar37.m128,*(undefined1 (*) [16])(pBVar26 + -0x487));
        rVar51 = (range<unsigned_long>)
                 vpaddq_avx((undefined1  [16])rVar51,*(undefined1 (*) [16])(pBVar26 + -0x485));
        BStack_4d18 = (BBox1f)((long)BStack_4d18 + (long)pBVar26[-0x483]);
        auVar57._8_8_ = 0;
        auVar57._0_4_ = pBVar26[-0x480].lower;
        auVar57._4_4_ = pBVar26[-0x480].upper;
        BVar33 = (BBox1f)vmovlps_avx(auVar50);
        *pBVar26 = BVar33;
        auVar48 = vcmpps_avx(auVar50,auVar57,1);
        auVar55 = vinsertps_avx(auVar50,auVar57,0x50);
        auVar58 = vblendps_avx(auVar57,auVar50,2);
        auVar50 = vblendvps_avx(auVar58,auVar55,auVar48);
        bVar35 = (ulong)BStack_4d10 < (ulong)BVar27;
        if ((ulong)BStack_4d10 <= (ulong)BVar27) {
          BStack_4d10 = BVar27;
        }
        auVar58 = vpshufd_avx(ZEXT416((uint)CONCAT71(BVar27._1_7_,bVar35)),0x50);
        auVar58 = vpslld_avx(auVar58,0x1f);
        auVar49 = vblendvps_avx(auVar49,auVar56,auVar58);
        pBVar26 = pBVar26 + 0x12;
        local_4dd8 = (BBox1f)((long)local_4dd8 - 1);
      } while (local_4dd8 != (BBox1f)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    lower.field_0 = aVar47;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    upper.field_0 = aVar45;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    lower.field_0 = aVar43;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    upper.field_0 = aVar41;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
    field_0 = aVar39;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
    field_0 = aVar37;
    __return_storage_ptr__->object_range = rVar51;
    __return_storage_ptr__->num_time_segments = (size_t)BStack_4d18;
    __return_storage_ptr__->max_num_time_segments = (size_t)BStack_4d10;
    BVar33 = (BBox1f)vmovlps_avx(auVar49);
    __return_storage_ptr__->max_time_range = BVar33;
    __return_storage_ptr__->time_range = local_4de0;
    return __return_storage_ptr__;
  }
  prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar19,"task cancelled");
  __cxa_throw(prVar19,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlurGrid(Scene* scene, mvector<PrimRefMB>& prims, BuildProgressMonitor& progressMonitor, BBox1f t0t1 = BBox1f(0.0f,1.0f))
      {
        /* first run to get #primitives */
        ParallelForForPrefixSumState<PrimInfoMB> pstate;
        Scene::Iterator<GridMesh,true> iter(scene);

        pstate.init(iter,size_t(1024));
        /* iterate over all meshes in the scene */
        PrimInfoMB pinfoMB = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](GridMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfoMB {
            
            PrimInfoMB pinfoMB(empty);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              if (!mesh->valid(j, mesh->timeSegmentRange(t0t1))) continue;
              LBBox3fa bounds(empty);
              PrimInfoMB gridMB(0,mesh->getNumSubGrids(j));
              pinfoMB.merge(gridMB);
            }
            return pinfoMB;
          }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        
        size_t numPrimitives = pinfoMB.size();
        if (numPrimitives == 0) return pinfoMB;

        /* resize arrays */
        sgrids.resize(numPrimitives); 
        prims.resize(numPrimitives); 
        /* second run to fill primrefs and SubGridBuildData arrays */
        pinfoMB = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](GridMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
            
            k = base.size();
            size_t p_index = k;
            PrimInfoMB pinfoMB(empty);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              if (!mesh->valid(j, mesh->timeSegmentRange(t0t1))) continue;
              const GridMesh::Grid &g = mesh->grid(j);
              
              for (unsigned int y=0; y<g.resY-1u; y+=2)
                for (unsigned int x=0; x<g.resX-1u; x+=2)
                {
                  const PrimRefMB prim(mesh->linearBounds(g,x,y,t0t1),mesh->numTimeSegments(),mesh->time_range,mesh->numTimeSegments(),unsigned(geomID),unsigned(p_index));
                  pinfoMB.add_primref(prim);
                  sgrids[p_index] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
                  prims[p_index++] = prim;                
                }
            }
            return pinfoMB;
          }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        
        assert(pinfoMB.size() == numPrimitives);
        pinfoMB.time_range = t0t1;
        return pinfoMB;
      }